

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferPoolTest.cpp
# Opt level: O1

void __thiscall BufferPool_SmallBuffers_Test::TestBody(BufferPool_SmallBuffers_Test *this)

{
  char **ppcVar1;
  BufferPool *this_00;
  FreeNode *node_1;
  FreeNode *pFVar2;
  long lVar3;
  size_t i;
  long lVar4;
  FreeNode *node;
  FreeNode *pFVar5;
  BufferPool local_118 [4];
  BufferPool local_58;
  
  memt::BufferPool::BufferPool(local_118,1);
  memt::BufferPool::BufferPool(local_118 + 1,2);
  memt::BufferPool::BufferPool(local_118 + 2,3);
  memt::BufferPool::BufferPool(local_118 + 3,4);
  memt::BufferPool::BufferPool(&local_58,5);
  lVar4 = 0;
  do {
    this_00 = local_118 + lVar4;
    pFVar5 = local_118[lVar4]._free;
    if (pFVar5 == (FreeNode *)0x0) {
      if (local_118[lVar4]._blocks._block._position == local_118[lVar4]._blocks._block._end) {
        memt::BufferPool::growCapacity(this_00);
      }
      pFVar5 = (FreeNode *)local_118[lVar4]._blocks._block._position;
      local_118[lVar4]._blocks._block._position =
           (char *)((long)&pFVar5->next + this_00->_bufferSize);
    }
    else {
      local_118[lVar4]._free = pFVar5->next;
    }
    pFVar2 = local_118[lVar4]._free;
    pFVar5->next = pFVar2;
    local_118[lVar4]._free = pFVar2;
    if (pFVar2 == (FreeNode *)0x0) {
      if (local_118[lVar4]._blocks._block._position == local_118[lVar4]._blocks._block._end) {
        memt::BufferPool::growCapacity(this_00);
      }
      pFVar2 = (FreeNode *)local_118[lVar4]._blocks._block._position;
      local_118[lVar4]._blocks._block._position =
           (char *)((long)&pFVar2->next + this_00->_bufferSize);
    }
    else {
      local_118[lVar4]._free = pFVar2->next;
    }
    if (local_118[lVar4]._free == (FreeNode *)0x0) {
      if (local_118[lVar4]._blocks._block._position == local_118[lVar4]._blocks._block._end) {
        memt::BufferPool::growCapacity(this_00);
      }
      ppcVar1 = &local_118[lVar4]._blocks._block._position;
      *ppcVar1 = *ppcVar1 + this_00->_bufferSize;
    }
    else {
      local_118[lVar4]._free = (local_118[lVar4]._free)->next;
    }
    pFVar2->next = local_118[lVar4]._free;
    local_118[lVar4]._free = pFVar2;
    lVar3 = 10000;
    do {
      if (local_118[lVar4]._free == (FreeNode *)0x0) {
        if (local_118[lVar4]._blocks._block._position == local_118[lVar4]._blocks._block._end) {
          memt::BufferPool::growCapacity(this_00);
        }
        ppcVar1 = &local_118[lVar4]._blocks._block._position;
        *ppcVar1 = *ppcVar1 + this_00->_bufferSize;
      }
      else {
        local_118[lVar4]._free = (local_118[lVar4]._free)->next;
      }
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    pFVar5->next = local_118[lVar4]._free;
    local_118[lVar4]._free = pFVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  lVar4 = 0xd0;
  do {
    memt::MemoryBlocks::freeAllBlocks((MemoryBlocks *)((long)&local_118[0]._bufferSize + lVar4));
    lVar4 = lVar4 + -0x30;
  } while (lVar4 != -0x20);
  return;
}

Assistant:

TEST(BufferPool, SmallBuffers) {
  memt::BufferPool pools[] = {1, 2, 3, 4, 5};
  for (size_t i = 0; i < sizeof(pools) / sizeof(memt::BufferPool); ++i) {
    memt::BufferPool& pool = pools[i];
    void* a = pool.alloc();
    pool.free(a);
    void* b = pool.alloc();
    void* c = pool.alloc();
    pool.alloc();
    pool.free(c);
    for (size_t i = 0; i < 10000; ++i)
      pool.alloc();
    pool.free(b);
  }
}